

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O2

void ZXing::DataMatrix::C40Encoder::EncodeC40
               (EncoderContext *context,
               function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *encodeChar,int encodingMode)

{
  int iVar1;
  SymbolInfo *pSVar2;
  logic_error *this;
  int iVar3;
  string buffer;
  string removed;
  function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
LAB_0016b3d9:
  while (context->_pos < (int)(context->_msg)._M_string_length - context->_skipAtEnd) {
    iVar1 = EncoderContext::currentChar(context);
    context->_pos = context->_pos + 1;
    iVar1 = std::
            function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(encodeChar,iVar1,&buffer);
    iVar3 = (*(int *)&(context->_codewords).
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
            *(int *)&(context->_codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) + (int)(buffer._M_string_length / 3) * 2;
    pSVar2 = EncoderContext::updateSymbolInfo(context,iVar3);
    if ((int)(context->_msg)._M_string_length - context->_skipAtEnd <= context->_pos) {
      removed._M_dataplus._M_p = (pointer)&removed.field_2;
      removed._M_string_length = 0;
      iVar3 = pSVar2->_dataCapacity - iVar3;
      removed.field_2._M_local_buf[0] = '\0';
      if (((int)(buffer._M_string_length % 3) == 2) && (iVar3 != 2)) {
        std::
        function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_70,encodeChar);
        iVar1 = BacktrackOneCharacter(context,&buffer,&removed,iVar1,&local_70);
        std::_Function_base::~_Function_base(&local_70.super__Function_base);
      }
      while( true ) {
        if (((int)(buffer._M_string_length % 3) != 1) || (iVar1 < 4 && iVar3 == 1)) break;
        std::
        function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_50,encodeChar);
        iVar1 = BacktrackOneCharacter(context,&buffer,&removed,iVar1,&local_50);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
      }
      std::__cxx11::string::~string((string *)&removed);
      break;
    }
    if (buffer._M_string_length % 3 == 0) goto LAB_0016b440;
  }
  goto LAB_0016b51e;
LAB_0016b440:
  iVar1 = LookAheadTest(&context->_msg,(long)context->_pos,encodingMode);
  if (iVar1 != encodingMode) goto code_r0x0016b450;
  goto LAB_0016b3d9;
code_r0x0016b450:
  context->_newEncoding = 0;
LAB_0016b51e:
  iVar1 = (int)buffer._M_string_length % 3;
  iVar3 = (*(int *)&(context->_codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(context->_codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                   .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) + ((int)buffer._M_string_length / 3) * 2;
  pSVar2 = EncoderContext::updateSymbolInfo(context,iVar3);
  if (iVar1 == 2) {
    std::__cxx11::string::push_back((char)&buffer);
    while (2 < buffer._M_string_length) {
      WriteNextTriplet(context,&buffer);
    }
LAB_0016b5e1:
    if ((int)(context->_msg)._M_string_length - context->_skipAtEnd <= context->_pos)
    goto LAB_0016b5f9;
  }
  else {
    iVar3 = pSVar2->_dataCapacity - iVar3;
    if ((iVar1 == 1) && (iVar3 == 1)) {
      while (2 < buffer._M_string_length) {
        WriteNextTriplet(context,&buffer);
      }
      iVar1 = context->_pos;
      if (iVar1 < (int)(context->_msg)._M_string_length - context->_skipAtEnd) {
        EncoderContext::addCodeword(context,0xfe);
        iVar1 = context->_pos;
      }
      context->_pos = iVar1 + -1;
      goto LAB_0016b5f9;
    }
    if (iVar1 != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unexpected case. Please report!");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    while (2 < buffer._M_string_length) {
      WriteNextTriplet(context,&buffer);
    }
    if (iVar3 < 1) goto LAB_0016b5e1;
  }
  EncoderContext::addCodeword(context,0xfe);
LAB_0016b5f9:
  context->_newEncoding = 0;
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

static void EncodeC40(EncoderContext& context, std::function<int (int, std::string&)> encodeChar, int encodingMode)
	{
		//step C
		std::string buffer;
		while (context.hasMoreCharacters()) {
			int c = context.currentChar();
			context.setCurrentPos(context.currentPos() + 1);
			int lastCharSize = encodeChar(c, buffer);
			int unwritten = narrow_cast<int>(buffer.length() / 3) * 2;
			int curCodewordCount = context.codewordCount() + unwritten;
			auto symbolInfo = context.updateSymbolInfo(curCodewordCount);
			int available = symbolInfo->dataCapacity() - curCodewordCount;

			if (!context.hasMoreCharacters()) {
				//Avoid having a single C40 value in the last triplet
				std::string removed;
				if ((buffer.length() % 3) == 2 && available != 2) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				while ((buffer.length() % 3) == 1 && ((lastCharSize <= 3 && available != 1) || lastCharSize > 3)) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				break;
			}

			if ((buffer.length() % 3) == 0) {
				int newMode = LookAheadTest(context.message(), context.currentPos(), encodingMode);
				if (newMode != encodingMode) {
					// Return to ASCII encodation, which will actually handle latch to new mode
					context.setNewEncoding(ASCII_ENCODATION);
					break;
				}
			}
		}
		return HandleEOD(context, buffer);
	}